

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

void __thiscall
QOpenGLShaderProgram::setAttributeBuffer
          (QOpenGLShaderProgram *this,char *name,GLenum type,int offset,int tupleSize,int stride)

{
  int location;
  
  location = attributeLocation(this,name);
  setAttributeBuffer(this,location,type,offset,tupleSize,stride);
  return;
}

Assistant:

void QOpenGLShaderProgram::setAttributeBuffer
    (const char *name, GLenum type, int offset, int tupleSize, int stride)
{
    setAttributeBuffer(attributeLocation(name), type, offset, tupleSize, stride);
}